

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O3

void Vec_VecFree(Vec_Vec_t *p)

{
  void *__ptr;
  int iVar1;
  long lVar2;
  
  iVar1 = p->nSize;
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      __ptr = p->pArray[lVar2];
      if (__ptr != (void *)0x0) {
        if (*(void **)((long)__ptr + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr + 8));
        }
        free(__ptr);
        iVar1 = p->nSize;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  if (p->pArray != (void **)0x0) {
    free(p->pArray);
  }
  free(p);
  return;
}

Assistant:

static inline void Vec_VecFree( Vec_Vec_t * p )
{
    Vec_Ptr_t * vVec;
    int i;
    Vec_VecForEachLevel( p, vVec, i )
        if ( vVec ) Vec_PtrFree( vVec );
    Vec_PtrFree( (Vec_Ptr_t *)p );
}